

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
BeliefSparse::InnerProduct
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,BeliefSparse *this,
          VectorSet *v,vector<bool,_std::allocator<bool>_> *mask)

{
  undefined1 auVar1 [16];
  long lVar2;
  const_reference cVar3;
  uint uVar4;
  ulong __n;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  BScit it;
  double local_58;
  value_type_conflict3 local_50;
  long *local_48;
  long *local_38;
  
  local_50 = -1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,v->size1_,&local_50,(allocator_type *)&stack0xffffffffffffffc0);
  for (uVar4 = 0; __n = (ulong)uVar4, v->size1_ != __n; uVar4 = uVar4 + 1) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
    if (cVar3) {
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::begin((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)&local_50);
      local_58 = 0.0;
      while( true ) {
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)&stack0xffffffffffffffc0);
        if (local_48 == local_38) break;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_58;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)((long)local_48 +
                                 (*(long *)((long)local_50 + 0x40) -
                                 *(long *)((long)local_50 + 0x28)));
        lVar2 = *local_48;
        local_48 = local_48 + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (v->data_).data_[v->size2_ * __n + lVar2];
        auVar1 = vfmadd231sd_fma(auVar6,auVar5,auVar1);
        local_58 = auVar1._0_8_;
      }
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[__n] = local_58;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefSparse::InnerProduct(const VectorSet &v,
                                          const vector<bool> &mask) const
{
    vector<double> values(v.size1(),-DBL_MAX);

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        if(mask[k])
        {
            x=0;
            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                x+=(*it)*v(k,it.index());
            values[k]=x;
        }
    }

    return(values);
}